

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O2

char * err_get_msg(err_msg_t *msg_array,size_t msg_count,int msgnum,int verbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (int)msg_count + -1;
  iVar2 = 0;
  while( true ) {
    if (iVar3 < iVar2) {
      return (char *)0x0;
    }
    iVar1 = (iVar3 - iVar2) / 2 + iVar2;
    if (msg_array[iVar1].msgnum == msgnum) break;
    if (msg_array[iVar1].msgnum < msgnum) {
      iVar2 = iVar1 + (uint)((iVar3 - iVar2) + 1U < 3);
    }
    else {
      iVar3 = iVar1 - (uint)(iVar1 == iVar3);
    }
  }
  return (&msg_array[iVar1].short_msgtxt)[verbose != 0];
}

Assistant:

const char *err_get_msg(const err_msg_t *msg_array, size_t msg_count,
                        int msgnum, int verbose)
{
    int hi, lo, cur;

    /* perform a binary search of the message list */
    lo = 0;
    hi = msg_count - 1;
    while (lo <= hi)
    {
        /* split the difference */
        cur = lo + (hi - lo)/2;

        /* is it a match? */
        if (msg_array[cur].msgnum == msgnum)
        {
            /* it's the one - return the text */
            return (verbose
                    ? msg_array[cur].long_msgtxt
                    : msg_array[cur].short_msgtxt);
        }
        else if (msgnum > msg_array[cur].msgnum)
        {
            /* we need to go higher */
            lo = (cur == lo ? cur + 1 : cur);
        }
        else
        {
            /* we need to go lower */
            hi = (cur == hi ? cur - 1 : cur);
        }
    }

    /* no such message */
    return 0;
}